

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O0

void u16From(u16 *dest,void *src,size_t count)

{
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  
  memMove(in_RSI,in_RDX,0x12ab65);
  if (((ulong)in_RDX & 1) != 0) {
    *(undefined1 *)(in_RDI + (long)in_RDX) = 0;
  }
  return;
}

Assistant:

void u16From(u16 dest[], const void* src, size_t count)
{
	ASSERT(memIsValid(src, count));
	ASSERT(memIsValid(dest, count + count % 2));
	memMove(dest, src, count);
	if (count % 2)
		((octet*)dest)[count] = 0;
#if (OCTET_ORDER == BIG_ENDIAN)
	for (count = (count + 1) / 2; count--;)
		dest[count] = u16Rev(dest[count]);
#endif // OCTET_ORDER
}